

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.cpp
# Opt level: O1

void * MissionLogThread(void *pParam)

{
  double dVar1;
  FILE *__stream;
  timespec *ptVar2;
  long *plVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar4;
  timespec local_90;
  double local_80;
  undefined1 local_78 [16];
  timespec *local_68;
  __syscall_slong_t *local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_60 = &chrono_mission.Duration.tv_nsec;
  local_68 = (timespec *)&chrono_mission.Duration;
  do {
    local_90.tv_sec = 0;
    local_90.tv_nsec = 100000000;
    nanosleep(&local_90,(timespec *)0x0);
    pthread_mutex_lock((pthread_mutex_t *)&MissionFilesCS);
    if ((bMissionRunning != 0) && (logmissionfile != (FILE *)0x0)) {
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      dVar1 = angle_env;
      local_38 = lat_env;
      local_48 = long_env;
      dVar4 = Center((interval *)&xhat);
      local_78._0_8_ = dVar4;
      local_40 = Center((interval *)&yhat);
      Center((interval *)&zhat);
      local_50 = cos(dVar1);
      local_58 = sin(dVar1);
      local_80 = sin(dVar1);
      dVar4 = cos(dVar1);
      local_80 = ((local_80 * (double)local_78._0_8_ + dVar4 * local_40) / 6371000.0) *
                 57.29577951308232 + local_38;
      dVar4 = 0.0;
      if ((2.220446049250313e-16 <= ABS(local_80 + -90.0)) &&
         (2.220446049250313e-16 <= ABS(local_80 + 90.0))) {
        local_78._0_8_ =
             (((double)local_78._0_8_ * local_50 - local_40 * local_58) / 6371000.0) *
             57.29577951308232;
        dVar4 = cos(local_80 * 0.017453292519943295);
        dVar4 = local_48 + (double)local_78._0_8_ / dVar4;
      }
      dVar1 = Center((interval *)&zhat);
      local_78._8_4_ = extraout_XMM0_Dc;
      local_78._0_8_ = dVar1;
      local_78._12_4_ = extraout_XMM0_Dd;
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      __stream = logmissionfile;
      ptVar2 = local_68;
      plVar3 = local_60;
      if (chrono_mission.Suspended == 0) {
        clock_gettime(4,&local_90);
        local_90.tv_sec =
             (local_90.tv_sec + chrono_mission.Duration.tv_sec +
             (local_90.tv_nsec + chrono_mission.Duration.tv_nsec) / 1000000000) -
             chrono_mission.Start.tv_sec;
        local_90.tv_nsec =
             (local_90.tv_nsec + chrono_mission.Duration.tv_nsec) % 1000000000 -
             chrono_mission.Start.tv_nsec;
        plVar3 = &local_90.tv_nsec;
        ptVar2 = &local_90;
        if (local_90.tv_nsec < 0) {
          local_90.tv_sec = local_90.tv_sec + local_90.tv_nsec / 1000000000 + -1;
          local_90.tv_nsec = local_90.tv_nsec % 1000000000 + 1000000000;
          plVar3 = &local_90.tv_nsec;
        }
      }
      fprintf((FILE *)__stream,"%f;%f;%f;%f;%s;\n",
              SUB84((double)*plVar3 / 1000000000.0 + (double)ptVar2->tv_sec,0),local_80,dVar4,
              local_78._0_8_ ^ 0x8000000000000000,szAction);
      fflush((FILE *)logmissionfile);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&MissionFilesCS);
  } while (bExit == 0);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE MissionLogThread(void* pParam)
{
	double lathat = 0, longhat = 0, althat = 0, depthhat = 0;

	UNREFERENCED_PARAMETER(pParam);

	for (;;)
	{
		mSleep(100);

		EnterCriticalSection(&MissionFilesCS);
		if (bMissionRunning&&(logmissionfile != NULL))
		{
			EnterCriticalSection(&StateVariablesCS);
			EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, Center(xhat), Center(yhat), Center(zhat), &lathat, &longhat, &althat);
			depthhat = -Center(zhat);
			LeaveCriticalSection(&StateVariablesCS);

			// szAction is not protected and might be temporarily invalid when it is changing, 
			// but this should not cause a crash...

			fprintf(logmissionfile, "%f;%f;%f;%f;%s;\n",
				GetTimeElapsedChronoQuick(&chrono_mission), lathat, longhat, depthhat, szAction
			);
			fflush(logmissionfile);
		}
		LeaveCriticalSection(&MissionFilesCS);

		if (bExit) break;
	}

	return 0;
}